

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# necro.c
# Opt level: O1

void spell_lesser_golem(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  byte *pbVar1;
  undefined2 uVar2;
  bool bVar3;
  short sVar4;
  int charges;
  int iVar5;
  MOB_INDEX_DATA *pMobIndex;
  CHAR_DATA *pCVar6;
  char *txt;
  AFFECT_DATA af;
  char type [4608];
  float local_12a8;
  float local_12a4;
  AFFECT_DATA local_12a0;
  char local_1238 [4616];
  
  target_name = one_argument(target_name,local_1238);
  charges = atoi(target_name);
  bVar3 = str_cmp(local_1238,"");
  if (bVar3) {
    bVar3 = str_cmp(local_1238,"blood");
    if (((bVar3) && (bVar3 = str_cmp(local_1238,"bone"), bVar3)) &&
       (bVar3 = str_cmp(local_1238,"flesh"), bVar3)) {
      txt = 
      "That is not an acceptable golem type.\n\rSyntax:  cast \'lesser golem\' <bone/blood/flesh> <ounces of blood>\n\r"
      ;
    }
    else if (charges == 0) {
      txt = 
      "You must use at least one ounce of blood.\n\rSyntax:  cast \'lesser golem\' <bone/blood/flesh> <ounces of blood>\n\r"
      ;
    }
    else if (charges < 0x15) {
      bVar3 = is_affected(ch,(int)gsn_lesser_golem);
      pCVar6 = char_list;
      if (bVar3) {
        txt = "You cannot create another lesser golem so soon.\n\r";
      }
      else {
        while( true ) {
          if (pCVar6 == (CHAR_DATA *)0x0) {
            bVar3 = drain_urn(ch,charges);
            if (!bVar3) {
              return;
            }
            bVar3 = str_cmp(local_1238,"blood");
            local_12a8 = 1.0;
            if (!bVar3) {
              local_12a8 = 1.5;
            }
            bVar3 = str_cmp(local_1238,"bone");
            local_12a4 = 1.0;
            if (!bVar3) {
              local_12a4 = 3.0;
              local_12a8 = 0.5;
            }
            bVar3 = str_cmp(local_1238,"flesh");
            if (!bVar3) {
              local_12a4 = 2.0;
              local_12a8 = 1.0;
            }
            init_affect(&local_12a0);
            local_12a0.where = 0;
            local_12a0.aftype = 7;
            local_12a0.location = 0;
            local_12a0.modifier = 0;
            iVar5 = dice(5,8);
            local_12a0.duration = (short)iVar5;
            local_12a0.type = (short)sn;
            local_12a0.level = ch->level;
            affect_to_char(ch,&local_12a0);
            pMobIndex = get_mob_index(0);
            pCVar6 = create_mobile(pMobIndex);
            sVar4 = (short)(int)((float)(int)ch->max_hit * local_12a4);
            pCVar6->max_hit = sVar4;
            pCVar6->hit = (int)sVar4;
            pCVar6->damroll = 0;
            sVar4 = ch->level + (short)(charges / 2) + -10;
            pCVar6->level = sVar4;
            pCVar6->damage[1] = 2;
            pCVar6->damage[0] = sVar4;
            pCVar6->damage[2] =
                 (short)(int)((float)charges * local_12a8) +
                 ((sVar4 / 3 + (sVar4 >> 0xf)) - (short)((long)sVar4 * 0x55555556 >> 0x3f));
            add_follower(pCVar6,ch);
            pCVar6->leader = ch;
            pbVar1 = (byte *)((long)pCVar6->affected_by + 2);
            *pbVar1 = *pbVar1 | 4;
            char_to_room(pCVar6,ch->in_room);
            act("$n pours some blood on the floor.  It begins shifting and changing, finally forming $N!"
                ,ch,(void *)0x0,pCVar6,0);
            act("You pour some blood on the floor.  It begins shifting and changing, finally forming $N!"
                ,ch,(void *)0x0,pCVar6,3);
            return;
          }
          bVar3 = is_npc(pCVar6);
          if (((bVar3) && (pCVar6->master == ch)) &&
             (uVar2 = pCVar6->pIndexData->vnum, (ushort)(uVar2 - 0xb8b) < 3)) break;
          pCVar6 = pCVar6->next;
        }
        txt = "You already have a golem under your command.\n\r";
      }
    }
    else {
      txt = "You cannot use more than twenty ounces of blood at once.\n\r";
    }
  }
  else {
    txt = "Syntax:  cast \'lesser golem\' <bone/blood/flesh> <ounces of blood>\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_lesser_golem(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *mob;
	int vnum = 0;
	float armorMultiplier = 1;
	float dmgMultiplier = 1;
	char type[MSL];
	int num;
	CHAR_DATA *check;
	AFFECT_DATA af;

	target_name = one_argument(target_name, type);
	num = atoi(target_name);

	if (!str_cmp(type, ""))
	{
		send_to_char("Syntax:  cast 'lesser golem' <bone/blood/flesh> <ounces of blood>\n\r", ch);
		return;
	}

	if (str_cmp(type, "blood") && str_cmp(type, "bone") && str_cmp(type, "flesh"))
	{
		send_to_char("That is not an acceptable golem type.\n\r" \
					"Syntax:  cast 'lesser golem' <bone/blood/flesh> <ounces of blood>\n\r", ch);
		return;
	}

	if (num == 0)
	{
		send_to_char("You must use at least one ounce of blood.\n\r" \
					"Syntax:  cast 'lesser golem' <bone/blood/flesh> <ounces of blood>\n\r", ch);
		return;
	}

	if (num > 20)
	{
		send_to_char("You cannot use more than twenty ounces of blood at once.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_lesser_golem))
	{
		send_to_char("You cannot create another lesser golem so soon.\n\r", ch);
		return;
	}

	for (check = char_list; check != nullptr; check = check->next)
	{
		if (is_npc(check)
			&& check->master == ch
			&& (check->pIndexData->vnum == 2955 || check->pIndexData->vnum == 2956 || check->pIndexData->vnum == 2957))
		{
			send_to_char("You already have a golem under your command.\n\r", ch);
			return;
		}
	}

	
	if (!drain_urn(ch, num))
		return;

	if (!str_cmp(type, "blood"))
	{
		vnum = 2957;
		armorMultiplier = 1;
		dmgMultiplier = 1.5;
	}

	if (!str_cmp(type, "bone"))
	{
		vnum = 2956;
		armorMultiplier = 3;
		dmgMultiplier = 0.5;
	}

	if (!str_cmp(type, "flesh"))
	{
		vnum = 2955;
		armorMultiplier =  2;
		dmgMultiplier = 1;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_TIMER;
	af.location = 0;
	af.modifier = 0;
	af.duration = dice(5, 8);
	af.type = sn;
	af.level = ch->level;
	affect_to_char(ch, &af);

	mob = create_mobile(get_mob_index(vnum));
	mob->max_hit = (short)(ch->max_hit * armorMultiplier);
	mob->hit = mob->max_hit;
	mob->damroll = 0;
	mob->level = ch->level - 10 + (num / 2);
	mob->damage[DICE_TYPE] = 2;
	mob->damage[DICE_NUMBER] = mob->level;
	mob->damage[DICE_BONUS] = (mob->level / 3) + (int)(num * dmgMultiplier);

	add_follower(mob, ch);

	mob->leader = ch;

	SET_BIT(mob->affected_by, AFF_CHARM);

	char_to_room(mob, ch->in_room);

	act("$n pours some blood on the floor.  It begins shifting and changing, finally forming $N!", ch, 0, mob, TO_ROOM);
	act("You pour some blood on the floor.  It begins shifting and changing, finally forming $N!", ch, 0, mob, TO_CHAR);
}